

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  iterator iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  allocator<char> local_aa;
  allocator<char> local_a9;
  key_type local_a8;
  key_type local_88;
  long local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  
  argm._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &argm._M_t._M_impl.super__Rb_tree_header._M_header;
  argm._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  argm._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  argm._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = (long)argc;
  argm._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       argm._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar7 = 1; lVar7 < local_68; lVar7 = lVar7 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,argv[lVar7],(allocator<char> *)&local_88);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,&local_a8);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    if ((*argv[lVar7] == '-') && (sVar4 = strlen(argv[lVar7]), 1 < sVar4)) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a8,'\x01');
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&argm,&local_a8);
      std::__cxx11::string::assign((char *)pmVar3);
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"--mouse",&local_a9);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&argm._M_t,&local_a8);
  p_Var1 = &argm._M_t._M_impl.super__Rb_tree_header;
  bVar8 = true;
  if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"m",&local_aa);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&argm._M_t,&local_88);
    bVar8 = (_Rb_tree_header *)iVar5._M_node != p_Var1;
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"--help",&local_a9);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&argm._M_t,&local_a8);
  if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"-h",&local_aa);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&argm._M_t,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) goto LAB_00106cac;
    bVar2 = hnInit();
    if (bVar2) {
      ImGui::DebugCheckVersionAndDataLayout("1.81",0x1558,0x414,8,0x10,0x14,2);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      g_screen = ImTui_ImplNcurses_Init(bVar8,60.0,3.0);
      ImTui_ImplText_Init();
      UI::State::changeColorScheme(&stateUI,false);
      do {
        bVar8 = render_frame();
      } while (bVar8);
      ImTui_ImplText_Shutdown();
      ImTui_ImplNcurses_Shutdown();
      iVar6 = 0;
      hnFree();
      goto LAB_00106cd3;
    }
    fwrite("Failed to initialize. Aborting\n",0x1f,1,_stderr);
  }
  else {
    std::__cxx11::string::~string((string *)&local_a8);
LAB_00106cac:
    puts("Usage: hnterm [-m] [-h]");
    puts("    -m, --mouse : ncurses mouse support");
    puts("    -h, --help  : print this help");
  }
  iVar6 = -1;
LAB_00106cd3:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&argm._M_t);
  return iVar6;
}

Assistant:

int main([[maybe_unused]] int argc, [[maybe_unused]] char ** argv) {
#ifndef __EMSCRIPTEN__
    auto argm = parseCmdArguments(argc, argv);
    int mouseSupport = argm.find("--mouse") != argm.end() || argm.find("m") != argm.end();
    if (argm.find("--help") != argm.end() || argm.find("-h") != argm.end()) {
        printf("Usage: hnterm [-m] [-h]\n");
        printf("    -m, --mouse : ncurses mouse support\n");
        printf("    -h, --help  : print this help\n");
        return -1;
    }
#endif

    if (hnInit() == false) {
        fprintf(stderr, "Failed to initialize. Aborting\n");
        return -1;
    }

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();

#ifdef __EMSCRIPTEN__
    g_screen = ImTui_ImplEmscripten_Init(true);
#else
    // when no changes occured - limit frame rate to 3.0 fps to save CPU
    g_screen = ImTui_ImplNcurses_Init(mouseSupport != 0, 60.0, 3.0);
#endif
    ImTui_ImplText_Init();

    stateUI.changeColorScheme(false);

#ifndef __EMSCRIPTEN__
    while (true) {
        if (render_frame() == false) break;
    }

    ImTui_ImplText_Shutdown();
    ImTui_ImplNcurses_Shutdown();
    hnFree();
#endif

    return 0;
}